

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * __thiscall
Util::join<std::__cxx11::string_const&,char_const*,std::__cxx11::string_const&>
          (string *__return_storage_ptr__,Util *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char **ts_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2)

{
  ostringstream stream;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  inner::join_helper<std::__cxx11::string_const&,char_const*,std::__cxx11::string_const&>
            ((ostringstream *)local_1a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char **)ts,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	std::ostringstream stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}